

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O2

uint32_t WriteBinaryTexture(aiTexture *tex)

{
  uint32_t ofs;
  uint32_t uVar1;
  uint32_t uVar2;
  size_t sVar3;
  int iVar4;
  
  ofs = WriteMagic(0x1236);
  uVar1 = Write<unsigned_int>(&tex->mWidth);
  uVar2 = Write<unsigned_int>(&tex->mHeight);
  sVar3 = fwrite(tex->achFormatHint,1,4,(FILE *)out);
  uVar1 = (int)sVar3 + uVar2 + uVar1;
  if (shortened == false) {
    iVar4 = 1;
    if (tex->mHeight != 0) {
      iVar4 = tex->mHeight * 4;
    }
    sVar3 = fwrite(tex->pcData,1,(ulong)(iVar4 * tex->mWidth),(FILE *)out);
    uVar1 = uVar1 + (int)sVar3;
  }
  ChangeInteger(ofs,uVar1);
  return uVar1;
}

Assistant:

uint32_t WriteBinaryTexture(const aiTexture* tex)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AITEXTURE);

	len += Write<unsigned int>(tex->mWidth);
	len += Write<unsigned int>(tex->mHeight);
	len += static_cast<uint32_t>(fwrite(tex->achFormatHint,1,4,out));

	if(!shortened) {
		if (!tex->mHeight) {
			len += static_cast<uint32_t>(fwrite(tex->pcData,1,tex->mWidth,out));
		}
		else {
			len += static_cast<uint32_t>(fwrite(tex->pcData,1,tex->mWidth*tex->mHeight*4,out));
		}
	}

	ChangeInteger(old,len);
	return len;
}